

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::reduce_26(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int in_ESI;
  shared_ptr<LNode> sVar1;
  shared_ptr<LNode> local_d0;
  shared_ptr<LNode> local_c0;
  shared_ptr<LNode> local_b0;
  LNodeFCStmt local_a0;
  undefined4 local_6c;
  shared_ptr<LNodeData<LNodeFCStmt>_> r;
  shared_ptr<LNode> stmts;
  undefined1 local_38 [8];
  shared_ptr<LNode> parameters;
  shared_ptr<LNode> name;
  LParser *this_local;
  
  get_node((LParser *)&parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  get_node((LParser *)local_38,in_ESI);
  get_node((LParser *)
           &r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           in_ESI);
  local_6c = 0x2d;
  std::shared_ptr<LNode>::shared_ptr
            (&local_b0,
             (shared_ptr<LNode> *)
             &parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::shared_ptr(&local_c0,(shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::shared_ptr
            (&local_d0,
             (shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  LNodeFCStmt::LNodeFCStmt(&local_a0,&local_b0,&local_c0,&local_d0);
  std::make_shared<LNodeData<LNodeFCStmt>,LNodeType,LNodeFCStmt>
            ((LNodeType *)&stack0xffffffffffffff98,(LNodeFCStmt *)&stack0xffffffffffffff94);
  LNodeFCStmt::~LNodeFCStmt(&local_a0);
  std::shared_ptr<LNode>::~shared_ptr(&local_d0);
  std::shared_ptr<LNode>::~shared_ptr(&local_c0);
  std::shared_ptr<LNode>::~shared_ptr(&local_b0);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<LNodeFCStmt>,void>
            ((shared_ptr<LNode> *)this,
             (shared_ptr<LNodeData<LNodeFCStmt>_> *)&stack0xffffffffffffff98);
  std::shared_ptr<LNodeData<LNodeFCStmt>_>::~shared_ptr
            ((shared_ptr<LNodeData<LNodeFCStmt>_> *)&stack0xffffffffffffff98);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &r.super___shared_ptr<LNodeData<LNodeFCStmt>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<LNode>::~shared_ptr((shared_ptr<LNode> *)local_38);
  std::shared_ptr<LNode>::~shared_ptr
            ((shared_ptr<LNode> *)
             &parameters.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::reduce_26() {
    // FCStmt : FUNCTION Var FBRAC Vars KET Brs Stmts END Brs
    auto name = this->get_node(8);
    auto parameters = this->get_node(6);
    auto stmts = this->get_node(3);
    auto r = std::make_shared<LNodeData<LNodeFCStmt>>(
            LNodeType::FCStmt,
            LNodeFCStmt(std::move(name), std::move(parameters), std::move(stmts))
    );
    return r;
}